

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferErrors.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureBufferErrors::verifyError
          (TextureBufferErrors *this,GLenum expected_error,char *description)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_1b0;
  GLenum local_30;
  GLboolean local_29;
  GLenum error_code;
  GLboolean test_passed;
  Functions *gl;
  char *description_local;
  TextureBufferErrors *pTStack_10;
  GLenum expected_error_local;
  TextureBufferErrors *this_local;
  
  gl = (Functions *)description;
  description_local._4_4_ = expected_error;
  pTStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _error_code = CONCAT44(extraout_var,iVar1);
  local_29 = '\x01';
  local_30 = (**(code **)(_error_code + 0x800))();
  if (local_30 != description_local._4_4_) {
    local_29 = '\0';
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<(&local_1b0,(char **)&gl);
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return local_29;
}

Assistant:

glw::GLboolean TextureBufferErrors::verifyError(const glw::GLenum expected_error, const char* description)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLboolean test_passed = true;
	glw::GLenum	error_code  = gl.getError();

	if (error_code != expected_error)
	{
		test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;
	}

	return test_passed;
}